

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

learner<char,_example> *
LEARNER::init_learner<char,example,LEARNER::learner<char,char>>
          (_func_void_char_ptr_learner<char,_char>_ptr_example_ptr *predict,size_t params_per_weight
          )

{
  learner<char,_example> *plVar1;
  size_t in_RSI;
  _func_void_char_ptr_learner<char,_char>_ptr_example_ptr *in_RDI;
  _func_void_char_ptr_learner<char,_char>_ptr_example_ptr *unaff_retaddr;
  prediction_type_t in_stack_ffffffffffffffec;
  
  plVar1 = learner<char,example>::init_learner<LEARNER::learner<char,char>>
                     ((char *)predict,(learner<char,_char> *)params_per_weight,unaff_retaddr,in_RDI,
                      in_RSI,in_stack_ffffffffffffffec);
  return plVar1;
}

Assistant:

learner<T, E>& init_learner(void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  return learner<T, E>::init_learner(
      nullptr, (L*)nullptr, predict, predict, params_per_weight, prediction_type::scalar);
}